

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_json.cc
# Opt level: O2

bool is_pdf_name(string *v)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if (v->_M_string_length < 4) {
    bVar1 = false;
  }
  else {
    std::__cxx11::string::substr((ulong)&local_30,(ulong)v);
    bVar1 = std::operator==(&local_30,"n:/");
    std::__cxx11::string::~string((string *)&local_30);
  }
  return bVar1;
}

Assistant:

static bool
is_pdf_name(std::string const& v)
{
    return ((v.length() > 3) && (v.substr(0, 3) == "n:/"));
}